

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texparameteriv(NegativeTestContext *ctx)

{
  GLuint *pGVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar4;
  ContextInfo *pCVar5;
  allocator<char> local_f1;
  string local_f0;
  deUint32 local_cc;
  ContextType local_c8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18 [2];
  GLuint texture;
  GLint params [1];
  NegativeTestContext *ctx_local;
  
  local_18[1] = 0x2601;
  local_18[0] = 0x1234;
  _texture = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,local_18);
  glu::CallLogWrapper::glBindTexture(&_texture->super_CallLogWrapper,0xde1,local_18[0]);
  pNVar2 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pGVar1 = local_18 + 1;
  glu::CallLogWrapper::glTexParameteriv(&_texture->super_CallLogWrapper,0,0x2801,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv(&_texture->super_CallLogWrapper,0xde1,0,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv(&_texture->super_CallLogWrapper,0,0,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  NegativeTestContext::endSection(_texture);
  pNVar2 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  local_18[1] = 0xffffffff;
  pGVar1 = local_18 + 1;
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x90ea,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x884c,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x884d,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x2800,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x2801,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x8e42,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x8e43,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x8e44,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x8e45,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x2802,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x2803,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x8072,(GLint *)pGVar1);
  NegativeTestContext::expectError(_texture,0x500);
  NegativeTestContext::endSection(_texture);
  pNVar2 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
             ,&local_99);
  NegativeTestContext::beginSection(pNVar2,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x813c,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x501);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0xde1,0x813d,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x501);
  NegativeTestContext::endSection(_texture);
  pNVar2 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
             ,&local_c1);
  NegativeTestContext::beginSection(pNVar2,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x1004,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x2801,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x2800,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x2802,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x2803,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x8072,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x813a,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x813b,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x884c,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x884d,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x500);
  pRVar4 = NegativeTestContext::getRenderContext(_texture);
  local_c8.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_cc = (deUint32)glu::ApiType::es(3,2);
  bVar3 = glu::contextSupports(local_c8,(ApiType)local_cc);
  if (bVar3) {
LAB_022c8983:
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x1004,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x2801,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x2800,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x2802,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x2803,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x8072,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x813a,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x813b,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x884c,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
    glu::CallLogWrapper::glTexParameteriv
              (&_texture->super_CallLogWrapper,0x9102,0x884d,(GLint *)(local_18 + 1));
    NegativeTestContext::expectError(_texture,0x500);
  }
  else {
    pCVar5 = NegativeTestContext::getContextInfo(_texture);
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (pCVar5,"GL_OES_texture_storage_multisample_2d_array");
    if (bVar3) goto LAB_022c8983;
  }
  NegativeTestContext::endSection(_texture);
  pNVar2 = _texture;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
             ,&local_f1);
  NegativeTestContext::beginSection(pNVar2,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_18[1] = 1;
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9100,0x813c,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x502);
  pRVar4 = NegativeTestContext::getRenderContext(_texture);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar3 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar3) {
    pCVar5 = NegativeTestContext::getContextInfo(_texture);
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (pCVar5,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar3) goto LAB_022c8d28;
  }
  local_18[1] = 1;
  glu::CallLogWrapper::glTexParameteriv
            (&_texture->super_CallLogWrapper,0x9102,0x813c,(GLint *)(local_18 + 1));
  NegativeTestContext::expectError(_texture,0x502);
LAB_022c8d28:
  NegativeTestContext::endSection(_texture);
  glu::CallLogWrapper::glDeleteTextures(&_texture->super_CallLogWrapper,1,local_18);
  return;
}

Assistant:

void texparameteriv (NegativeTestContext& ctx)
{
	GLint params[1] = {GL_LINEAR};

	GLuint texture = 0x1234;
	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values.");
	ctx.glTexParameteriv(0, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, 0, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(0, 0, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	params[0] = -1;
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	params[0] = 1;
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		params[0] = 1;
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, &params[0]);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}